

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

LArYieldResult * __thiscall
NEST::LArNEST::GetLeptonLETYields
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,double energy,double dx,
          double efield,double density)

{
  double dVar1;
  double dVar2;
  double ratio;
  double LET;
  double exciton_yields;
  double ionization_yields;
  LArYieldResult result;
  double density_local;
  double efield_local;
  double dx_local;
  double energy_local;
  LArNEST *this_local;
  
  exciton_yields = GetCanonicalIonizationYields(this,energy);
  if (exciton_yields < 0.0) {
    exciton_yields = 0.0;
  }
  dVar1 = this->fNexOverNion;
  ratio = 0.0;
  if ((dx != 0.0) || (NAN(dx))) {
    ratio = (energy / dx) * (1.0 / density);
  }
  if (((0.0 < ratio) && (0.0 < energy)) && (0.0 < dx)) {
    dVar2 = GetLinearEnergyTransfer(this,energy * 1000.0,false);
    if (dVar2 / ratio < 0.7) {
      ratio = (dVar2 / ratio) * ratio;
    }
  }
  GetLETRecombinationYields
            (__return_storage_ptr__,this,exciton_yields,dVar1 * exciton_yields,energy,ratio,efield);
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::GetLeptonLETYields(double energy, double dx,
                                           double efield, double density) {
  LArYieldResult result;
  double ionization_yields = GetCanonicalIonizationYields(energy);
  if (ionization_yields < 0.0) {
    ionization_yields = 0.0;
  }
  double exciton_yields = fNexOverNion * ionization_yields;
  double LET = 0.0;
  if (dx) {
    LET = (energy / dx) * (1 / density);  // lin. energy xfer (prop. to dE/dx)
  }
  if (LET > 0 && energy > 0 && dx > 0) {
    double ratio = GetLinearEnergyTransfer(energy * 1e3) / LET;
    if (ratio < 0.7) {
      dx /= ratio;
      LET *= ratio;
    }
  }
  return GetLETRecombinationYields(ionization_yields, exciton_yields, energy,
                                   LET, efield);
}